

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

void pbrt::Bump<pbrt::UniversalTextureEvaluator>
               (ulong *param_1,Image *param_2,undefined1 (*param_3) [12],float *param_4,
               undefined8 *param_5)

{
  ulong uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Float FVar13;
  float fVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  float fVar43;
  float fVar44;
  undefined1 auVar41 [16];
  float fVar45;
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  UniversalTextureEvaluator local_199;
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  Float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  float local_14c;
  undefined8 local_148;
  undefined4 local_140;
  undefined8 local_138;
  undefined4 local_130;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined8 uStack_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  int iStack_dc;
  undefined8 local_d8;
  float fStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined8 uStack_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  int iStack_9c;
  undefined8 local_98;
  float fStack_90;
  undefined8 uStack_8c;
  undefined4 uStack_84;
  undefined8 uStack_80;
  undefined4 uStack_78;
  undefined8 uStack_74;
  undefined1 auStack_6c [16];
  int iStack_5c;
  undefined1 local_58 [16];
  ulong local_48;
  ulong local_40;
  ulong local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_38 = *param_1;
  if ((local_38 & 0xffffffffffff) == 0) {
    _local_188 = vinsertps_avx(*(undefined1 (*) [16])(param_3 + 1),
                               ZEXT416((uint)(1.0 - *(float *)(param_3[1] + 4))),0x10);
    local_198._0_4_ = Image::BilerpChannel(param_2,(Point2f)local_188,0,(WrapMode2D)0x0);
    local_198._4_4_ = extraout_XMM0_Db;
    local_198._8_4_ = extraout_XMM0_Dc;
    local_198._12_4_ = extraout_XMM0_Dd;
    local_178 = Image::BilerpChannel(param_2,(Point2f)local_188,1,(WrapMode2D)0x0);
    fStack_174 = extraout_XMM0_Db_00;
    fStack_170 = extraout_XMM0_Dc_00;
    fStack_16c = extraout_XMM0_Dd_00;
    auVar18._0_4_ = Image::BilerpChannel(param_2,(Point2f)local_188,2,(WrapMode2D)0x0);
    auVar18._4_60_ = extraout_var;
    auVar10 = vinsertps_avx(local_198,ZEXT416((uint)local_178),0x10);
    auVar11._8_4_ = 0x40000000;
    auVar11._0_8_ = 0x4000000040000000;
    auVar11._12_4_ = 0x40000000;
    auVar47._8_4_ = 0xbf800000;
    auVar47._0_8_ = 0xbf800000bf800000;
    auVar47._12_4_ = 0xbf800000;
    auVar11 = vfmadd213ps_avx512vl(auVar11,auVar10,auVar47);
    auVar10._0_4_ = auVar11._0_4_ * auVar11._0_4_;
    auVar10._4_4_ = auVar11._4_4_ * auVar11._4_4_;
    auVar10._8_4_ = auVar11._8_4_ * auVar11._8_4_;
    auVar10._12_4_ = auVar11._12_4_ * auVar11._12_4_;
    auVar10 = vhaddps_avx(auVar10,auVar10);
    auVar47 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar18._0_16_,ZEXT416(0xbf800000));
    fVar14 = auVar47._0_4_;
    fVar9 = auVar10._0_4_ + fVar14 * fVar14;
    if (fVar9 < 0.0) {
      local_188._0_4_ = fVar14;
      local_198 = auVar11;
      fVar9 = sqrtf(fVar9);
      auVar11 = local_198;
      fVar14 = (float)local_188._0_4_;
    }
    else {
      auVar10 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
      fVar9 = auVar10._0_4_;
    }
    auVar12._4_4_ = fVar9;
    auVar12._0_4_ = fVar9;
    auVar12._8_4_ = fVar9;
    auVar12._12_4_ = fVar9;
    auVar10 = vdivps_avx(auVar11,auVar12);
    fVar14 = fVar14 / fVar9;
    uVar1 = *(ulong *)(param_3[1] + 8);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar1;
    fVar9 = *(float *)(param_3[2] + 4);
    auVar38._8_4_ = 0x80000000;
    auVar38._0_8_ = 0x8000000080000000;
    auVar38._12_4_ = 0x80000000;
    auVar41._8_4_ = 0x3f800000;
    auVar41._0_8_ = 0x3f8000003f800000;
    auVar41._12_4_ = 0x3f800000;
    auVar11 = vpternlogd_avx512vl(auVar41,ZEXT416((uint)fVar9),auVar38,0xf8);
    fVar39 = auVar11._0_4_;
    auVar46._0_4_ = -1.0 / (fVar9 + fVar39);
    auVar47 = vmovshdup_avx(auVar34);
    local_178 = (Float)uVar1;
    fVar35 = local_178 * auVar47._0_4_ * auVar46._0_4_;
    auVar48._0_4_ = local_178 * fVar39 * local_178;
    fVar20 = (float)(uVar1 >> 0x20);
    auVar48._4_4_ = fVar20 * 0.0;
    auVar48._8_8_ = 0;
    auVar46._4_4_ = auVar46._0_4_;
    auVar46._8_4_ = auVar46._0_4_;
    auVar46._12_4_ = auVar46._0_4_;
    auVar49._8_4_ = 0x3f800000;
    auVar49._0_8_ = 0x3f8000003f800000;
    auVar49._12_4_ = 0x3f800000;
    auVar47 = vunpcklps_avx(auVar49,auVar11);
    auVar11 = vfmadd231ps_fma(auVar47,auVar48,auVar46);
    fVar21 = auVar10._0_4_;
    auVar12 = vpermi2ps_avx512vl(_DAT_02875000,ZEXT416((uint)(fVar39 * fVar35)),
                                 ZEXT416((uint)fVar35));
    auVar47 = vshufps_avx(auVar10,auVar10,0xe1);
    fVar40 = fVar21 * auVar11._0_4_ + auVar47._0_4_ * auVar12._0_4_;
    fVar43 = auVar10._4_4_ * auVar11._4_4_ + auVar47._4_4_ * auVar12._4_4_;
    fVar44 = auVar10._8_4_ * auVar11._8_4_ + auVar47._8_4_ * auVar12._8_4_;
    fVar45 = auVar10._12_4_ * auVar11._12_4_ + auVar47._12_4_ * auVar12._12_4_;
    auVar26._0_4_ = fVar21 * local_178;
    auVar26._4_4_ = auVar10._4_4_ * fVar20;
    auVar26._8_4_ = auVar10._8_4_ * 0.0;
    auVar26._12_4_ = auVar10._12_4_ * 0.0;
    auVar10 = vmovshdup_avx(auVar26);
    fVar21 = fVar21 * local_178 * -fVar39 - auVar10._0_4_;
    local_178 = fVar14 * local_178;
    fVar35 = (float)*(undefined8 *)param_3[3];
    fVar39 = (float)((ulong)*(undefined8 *)param_3[3] >> 0x20);
    auVar27._0_4_ = fVar35 * fVar35;
    auVar27._4_4_ = fVar39 * fVar39;
    auVar27._8_8_ = 0;
    auVar10 = vmovshdup_avx(auVar27);
    fVar35 = *(float *)(param_3[2] + 8) * *(float *)(param_3[2] + 8) + auVar27._0_4_ + auVar10._0_4_
    ;
    if (fVar35 < 0.0) {
      local_188._4_4_ = fVar43;
      local_188._0_4_ = fVar40;
      fStack_180 = fVar44;
      fStack_17c = fVar45;
      local_198._0_4_ = fVar21;
      local_128._0_4_ = fVar14 * fVar9;
      fStack_174 = fVar14 * fVar20;
      fStack_170 = fVar14 * 0.0;
      fStack_16c = fVar14 * 0.0;
      auVar19._0_4_ = sqrtf(fVar35);
      auVar19._4_60_ = extraout_var_00;
      local_168 = auVar19._0_16_;
      fVar9 = (float)local_128._0_4_;
      fVar40 = (float)local_188._0_4_;
      fVar43 = (float)local_188._4_4_;
      fVar44 = fStack_180;
      fVar45 = fStack_17c;
      fVar35 = fStack_174;
      fVar20 = fStack_170;
      fVar14 = fStack_16c;
    }
    else {
      local_168 = vsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
      fVar9 = fVar14 * fVar9;
      local_198._0_4_ = fVar21;
      fVar35 = fVar14 * fVar20;
      fVar20 = fVar14 * 0.0;
      fVar14 = fVar14 * 0.0;
    }
    auVar42._0_4_ = local_178 + fVar40;
    auVar42._4_4_ = fVar35 + fVar43;
    auVar42._8_4_ = fVar20 + fVar44;
    auVar42._12_4_ = fVar14 + fVar45;
    local_178 = fVar9 + (float)local_198._0_4_;
    fVar9 = (float)*(undefined8 *)param_3[4];
    fVar14 = (float)((ulong)*(undefined8 *)param_3[4] >> 0x20);
    auVar28._0_4_ = fVar9 * fVar9;
    auVar28._4_4_ = fVar14 * fVar14;
    auVar28._8_8_ = 0;
    auVar10 = vmovshdup_avx(auVar28);
    fVar9 = *(float *)(param_3[3] + 8) * *(float *)(param_3[3] + 8) + auVar28._0_4_ + auVar10._0_4_;
    local_198 = auVar42;
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      auVar10 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
      fVar9 = auVar10._0_4_;
    }
    local_188._0_4_ = fVar9;
    uVar1 = *(ulong *)(param_3[2] + 8);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar1;
    auVar47 = vmovshdup_avx(local_198);
    auVar29._0_4_ = local_198._0_4_ * (float)uVar1;
    auVar29._4_4_ = local_198._4_4_ * (float)(uVar1 >> 0x20);
    auVar29._8_4_ = local_198._8_4_ * 0.0;
    auVar29._12_4_ = local_198._12_4_ * 0.0;
    auVar10 = vmovshdup_avx(auVar29);
    auVar10 = vfmadd231ss_fma(auVar10,auVar16,local_198);
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)*(float *)(param_3[3] + 4)),
                              ZEXT416((uint)local_178));
    fVar9 = auVar10._0_4_;
    auVar36._0_4_ = local_198._0_4_ * fVar9;
    auVar36._4_4_ = local_198._4_4_ * fVar9;
    auVar36._8_4_ = local_198._8_4_ * fVar9;
    auVar36._12_4_ = local_198._12_4_ * fVar9;
    auVar11 = vsubps_avx(auVar16,auVar36);
    auVar17._0_4_ = auVar11._0_4_ * auVar11._0_4_;
    auVar17._4_4_ = auVar11._4_4_ * auVar11._4_4_;
    auVar17._8_4_ = auVar11._8_4_ * auVar11._8_4_;
    auVar17._12_4_ = auVar11._12_4_ * auVar11._12_4_;
    auVar10 = vhaddps_avx(auVar17,auVar17);
    fVar14 = *(float *)(param_3[3] + 4) - local_178 * fVar9;
    fVar9 = fVar14 * fVar14 + auVar10._0_4_;
    if (fVar9 < 0.0) {
      local_14c = fVar14;
      local_128 = auVar47;
      local_58 = auVar11;
      fVar9 = sqrtf(fVar9);
      fVar14 = local_14c;
      auVar47 = local_128;
      auVar11 = local_58;
    }
    else {
      auVar10 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
      fVar9 = auVar10._0_4_;
    }
    auVar30._4_4_ = fVar9;
    auVar30._0_4_ = fVar9;
    auVar30._8_4_ = fVar9;
    auVar30._12_4_ = fVar9;
    auVar10 = vdivps_avx(auVar11,auVar30);
    auVar31._0_4_ = (float)local_168._0_4_ * auVar10._0_4_;
    auVar31._4_4_ = (float)local_168._0_4_ * auVar10._4_4_;
    auVar31._8_4_ = (float)local_168._0_4_ * auVar10._8_4_;
    auVar31._12_4_ = (float)local_168._0_4_ * auVar10._12_4_;
    fVar20 = (float)local_168._0_4_ * (fVar14 / fVar9);
    uVar5 = vmovlps_avx(auVar31);
    *(undefined8 *)param_4 = uVar5;
    param_4[2] = fVar20;
    fVar9 = *param_4;
    fVar14 = param_4[1];
    auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar20),auVar47,ZEXT416((uint)(local_178 * fVar14)));
    auVar11 = vfnmadd231ss_fma(ZEXT416((uint)(local_178 * fVar14)),ZEXT416((uint)local_178),
                               ZEXT416((uint)fVar14));
    fVar35 = auVar11._0_4_ + auVar10._0_4_;
    auVar11 = ZEXT416((uint)(local_198._0_4_ * fVar20));
    auVar10 = vfmsub213ss_fma(ZEXT416((uint)local_178),ZEXT416((uint)fVar9),auVar11);
    auVar11 = vfnmadd213ss_fma(ZEXT416((uint)fVar20),local_198,auVar11);
    local_178 = auVar10._0_4_ + auVar11._0_4_;
    auVar11 = ZEXT416((uint)(auVar47._0_4_ * fVar9));
    auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar14),local_198,auVar11);
    auVar47 = vfnmadd213ss_fma(ZEXT416((uint)fVar9),auVar47,auVar11);
    fVar9 = auVar10._0_4_ + auVar47._0_4_;
    fVar14 = fVar9 * fVar9 + fVar35 * fVar35 + local_178 * local_178;
    if (fVar14 < 0.0) {
      local_198._0_4_ = fVar35;
      local_168._0_4_ = fVar9;
      fVar14 = sqrtf(fVar14);
    }
    else {
      auVar10 = vsqrtss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
      fVar14 = auVar10._0_4_;
      local_168._0_4_ = fVar9;
      local_198._0_4_ = fVar35;
    }
    auVar10 = vinsertps_avx(ZEXT416((uint)((float)local_188._0_4_ *
                                          ((float)local_198._0_4_ / fVar14))),
                            ZEXT416((uint)((float)local_188._0_4_ * (local_178 / fVar14))),0x10);
    uVar5 = vmovlps_avx(auVar10);
    *param_5 = uVar5;
    *(float *)(param_5 + 1) = (float)local_188._0_4_ * ((float)local_168._0_4_ / fVar14);
  }
  else {
    iVar2 = *(int *)param_3[10];
    local_130 = *(undefined4 *)(param_3[8] + 8);
    local_138 = *(undefined8 *)param_3[8];
    local_148 = *(undefined8 *)param_3[9];
    local_140 = *(undefined4 *)(param_3[9] + 8);
    uStack_84 = *(undefined4 *)(param_3[8] + 8);
    uVar3 = *(undefined8 *)param_3[8];
    uVar4 = *(undefined8 *)param_3[9];
    uStack_78 = *(undefined4 *)(param_3[9] + 8);
    local_168 = *(undefined1 (*) [16])(param_3[6] + 8);
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar10 = vandps_avx512vl(local_168,auVar7);
    auVar10 = vhaddps_avx(auVar10,auVar10);
    fVar9 = auVar10._0_4_ * 0.5;
    uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar9),ZEXT816(0) << 0x20,0);
    bVar6 = (bool)((byte)uVar5 & 1);
    fVar9 = (float)((uint)bVar6 * 0x3a03126f + (uint)!bVar6 * (int)fVar9);
    _local_188 = ZEXT416((uint)fVar9);
    fStack_90 = fVar9 * *(float *)(param_3[3] + 4) + *(float *)(*param_3 + 8);
    auVar22._0_4_ = fVar9 * (float)*(undefined8 *)(param_3[2] + 8) + (float)*(undefined8 *)*param_3;
    auVar22._4_4_ =
         fVar9 * (float)((ulong)*(undefined8 *)(param_3[2] + 8) >> 0x20) +
         (float)((ulong)*(undefined8 *)*param_3 >> 0x20);
    auVar22._8_4_ = fVar9 * 0.0 + 0.0;
    auVar22._12_4_ = fVar9 * 0.0 + 0.0;
    auVar32._0_4_ = fVar9 + (float)*(undefined8 *)param_3[1];
    auVar32._4_4_ = (float)((ulong)*(undefined8 *)param_3[1] >> 0x20) + 0.0;
    auVar32._8_8_ = 0;
    local_98 = vmovlps_avx(auVar22);
    uVar5 = vmovlps_avx(auVar32);
    uStack_8c._0_4_ = (undefined4)uVar3;
    uStack_8c._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
    uStack_80._0_4_ = (undefined4)uVar4;
    uStack_80._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
    uStack_74._0_4_ = (undefined4)uVar5;
    uStack_74._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    auStack_6c._0_4_ = local_168._0_4_;
    auStack_6c._4_4_ = local_168._4_4_;
    auStack_6c._8_4_ = local_168._8_4_;
    auStack_6c._12_4_ = local_168._12_4_;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.z = fStack_90;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_98;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)local_98 >> 0x20);
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)uStack_8c;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_8c._4_4_;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_84;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)uStack_80;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_80._4_4_;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_78;
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(undefined4)uStack_74;
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_74._4_4_;
    ctx.dudx = (Float)auStack_6c._0_4_;
    ctx.dudy = (Float)auStack_6c._4_4_;
    ctx.dvdx = (Float)auStack_6c._8_4_;
    ctx.dvdy = (Float)auStack_6c._12_4_;
    ctx.faceIndex = iVar2;
    uStack_8c = uVar3;
    uStack_80 = uVar4;
    uStack_74 = uVar5;
    auStack_6c = local_168;
    iStack_5c = iVar2;
    local_178 = UniversalTextureEvaluator::operator()(&local_199,(FloatTextureHandle)&local_38,ctx);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)(param_3[7] + 4);
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar10 = vandps_avx512vl(auVar23,auVar8);
    auVar10 = vhaddps_avx(auVar10,auVar10);
    fVar9 = auVar10._0_4_ * 0.5;
    uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar9),ZEXT416(0),0);
    bVar6 = (bool)((byte)uVar5 & 1);
    fVar9 = (float)((uint)bVar6 * 0x3a03126f + (uint)!bVar6 * (int)fVar9);
    local_198 = ZEXT416((uint)fVar9);
    auVar37._4_4_ = fVar9;
    auVar37._0_4_ = fVar9;
    auVar37._8_4_ = fVar9;
    auVar37._12_4_ = fVar9;
    auVar15._0_4_ = (float)*(undefined8 *)*param_3 + (float)*(undefined8 *)(param_3[3] + 8) * fVar9;
    auVar15._4_4_ =
         (float)((ulong)*(undefined8 *)*param_3 >> 0x20) +
         (float)((ulong)*(undefined8 *)(param_3[3] + 8) >> 0x20) * fVar9;
    auVar15._8_4_ = fVar9 * 0.0 + 0.0;
    auVar15._12_4_ = fVar9 * 0.0 + 0.0;
    fStack_d0 = fVar9 * *(float *)(param_3[4] + 4) + *(float *)(*param_3 + 8);
    auVar10 = vblendps_avx(auVar37,ZEXT416(0) << 0x20,0xd);
    auVar33._0_4_ = auVar10._0_4_ + (float)*(undefined8 *)param_3[1];
    auVar33._4_4_ = auVar10._4_4_ + (float)((ulong)*(undefined8 *)param_3[1] >> 0x20);
    auVar33._8_4_ = auVar10._8_4_ + 0.0;
    auVar33._12_4_ = auVar10._12_4_ + 0.0;
    local_40 = *param_1;
    local_d8 = vmovlps_avx(auVar15);
    uStack_c4 = local_130;
    uStack_cc = (undefined4)local_138;
    uStack_c8 = (undefined4)((ulong)local_138 >> 0x20);
    uStack_b8 = local_140;
    uStack_c0 = local_148;
    uVar5 = vmovlps_avx(auVar33);
    uStack_b4 = (undefined4)uVar5;
    uStack_b0 = (undefined4)((ulong)uVar5 >> 0x20);
    uStack_ac = local_168._0_4_;
    uStack_a8 = local_168._4_4_;
    uStack_a4 = local_168._8_4_;
    uStack_a0 = local_168._12_4_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = fStack_d0;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_d8;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)local_d8 >> 0x20);
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)uStack_cc;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_c8;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_130;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_148;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)local_148 >> 0x20);
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_140;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)uStack_b4;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_b0;
    ctx_00.dudx = (Float)uStack_ac;
    ctx_00.dudy = (Float)uStack_a8;
    ctx_00.dvdx = (Float)uStack_a4;
    ctx_00.dvdy = (Float)uStack_a0;
    ctx_00.faceIndex = iVar2;
    iStack_9c = iVar2;
    FVar13 = UniversalTextureEvaluator::operator()(&local_199,(FloatTextureHandle)&local_40,ctx_00);
    local_168._0_4_ = FVar13;
    local_48 = *param_1;
    iStack_dc = *(int *)param_3[10];
    uStack_110 = *(undefined4 *)(*param_3 + 8);
    local_118 = *(undefined8 *)*param_3;
    uStack_104 = *(undefined4 *)(param_3[8] + 8);
    uStack_10c = (undefined4)*(undefined8 *)param_3[8];
    uStack_108 = (undefined4)((ulong)*(undefined8 *)param_3[8] >> 0x20);
    uStack_f8 = *(undefined4 *)(param_3[9] + 8);
    uStack_100 = *(undefined8 *)param_3[9];
    uStack_f4 = (undefined4)*(undefined8 *)param_3[1];
    uStack_f0 = (undefined4)((ulong)*(undefined8 *)param_3[1] >> 0x20);
    uStack_ec = (undefined4)*(undefined8 *)(param_3[6] + 8);
    uStack_e8 = (undefined4)((ulong)*(undefined8 *)(param_3[6] + 8) >> 0x20);
    uStack_e4 = (undefined4)*(undefined8 *)(param_3[7] + 4);
    uStack_e0 = (undefined4)((ulong)*(undefined8 *)(param_3[7] + 4) >> 0x20);
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)uStack_10c;
    ctx_01.p.super_Tuple3<pbrt::Point3,_float> = (Tuple3<pbrt::Point3,_float>)*param_3;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_108;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_104;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uStack_100;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uStack_100 >> 0x20);
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_f8;
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)uStack_f4;
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_f0;
    ctx_01.dudx = (Float)uStack_ec;
    ctx_01.dudy = (Float)uStack_e8;
    ctx_01.dvdx = (Float)uStack_e4;
    ctx_01.dvdy = (Float)uStack_e0;
    ctx_01.faceIndex = iStack_dc;
    FVar13 = UniversalTextureEvaluator::operator()(&local_199,(FloatTextureHandle)&local_48,ctx_01);
    fVar20 = (local_178 - FVar13) / (float)local_188._0_4_;
    fVar9 = *(float *)(param_3[2] + 4);
    fVar14 = *(float *)(param_3[3] + 4);
    fVar35 = *(float *)(param_3[5] + 4);
    auVar24._0_4_ =
         (float)*(undefined8 *)(param_3[1] + 8) * fVar20 + (float)*(undefined8 *)(param_3[2] + 8) +
         FVar13 * (float)*(undefined8 *)(param_3[4] + 8);
    auVar24._4_4_ =
         (float)((ulong)*(undefined8 *)(param_3[1] + 8) >> 0x20) * fVar20 +
         (float)((ulong)*(undefined8 *)(param_3[2] + 8) >> 0x20) +
         FVar13 * (float)((ulong)*(undefined8 *)(param_3[4] + 8) >> 0x20);
    auVar24._8_4_ = fVar20 * 0.0 + 0.0 + FVar13 * 0.0;
    auVar24._12_4_ = fVar20 * 0.0 + 0.0 + FVar13 * 0.0;
    uVar5 = vmovlps_avx(auVar24);
    *(undefined8 *)param_4 = uVar5;
    param_4[2] = fVar20 * fVar9 + fVar14 + FVar13 * fVar35;
    local_198._0_4_ = ((float)local_168._0_4_ - FVar13) / (float)local_198._0_4_;
    fVar9 = *(float *)(param_3[2] + 4);
    fVar14 = *(float *)(param_3[4] + 4);
    fVar35 = *(float *)(param_3[6] + 4);
    auVar25._0_4_ =
         (float)local_198._0_4_ * (float)*(undefined8 *)(param_3[1] + 8) +
         (float)*(undefined8 *)(param_3[3] + 8) + FVar13 * (float)*(undefined8 *)(param_3[5] + 8);
    auVar25._4_4_ =
         (float)local_198._0_4_ * (float)((ulong)*(undefined8 *)(param_3[1] + 8) >> 0x20) +
         (float)((ulong)*(undefined8 *)(param_3[3] + 8) >> 0x20) +
         FVar13 * (float)((ulong)*(undefined8 *)(param_3[5] + 8) >> 0x20);
    auVar25._8_4_ = (float)local_198._0_4_ * 0.0 + 0.0 + FVar13 * 0.0;
    auVar25._12_4_ = (float)local_198._0_4_ * 0.0 + 0.0 + FVar13 * 0.0;
    uVar5 = vmovlps_avx(auVar25);
    *param_5 = uVar5;
    *(float *)(param_5 + 1) = (float)local_198._0_4_ * fVar9 + fVar14 + FVar13 * fVar35;
  }
  return;
}

Assistant:

PBRT_CPU_GPU void Bump(TextureEvaluator texEval, FloatTextureHandle displacement,
                       const Image *normalMap, const BumpEvalContext &ctx, Vector3f *dpdu,
                       Vector3f *dpdv) {
    DCHECK(displacement != nullptr || normalMap != nullptr);
    if (displacement) {
        if (displacement)
            DCHECK(texEval.CanEvaluate({displacement}, {}));
        // Compute offset positions and evaluate displacement texture
        TextureEvalContext shiftedCtx = ctx;
        // Shift _shiftedCtx_ _du_ in the $u$ direction
        Float du = .5f * (std::abs(ctx.dudx) + std::abs(ctx.dudy));
        if (du == 0)
            du = .0005f;
        shiftedCtx.p = ctx.p + du * ctx.shading.dpdu;
        shiftedCtx.uv = ctx.uv + Vector2f(du, 0.f);

        Float uDisplace = texEval(displacement, shiftedCtx);
        // Shift _shiftedCtx_ _dv_ in the $v$ direction
        Float dv = .5f * (std::abs(ctx.dvdx) + std::abs(ctx.dvdy));
        if (dv == 0)
            dv = .0005f;
        shiftedCtx.p = ctx.p + dv * ctx.shading.dpdv;
        shiftedCtx.uv = ctx.uv + Vector2f(0.f, dv);

        Float vDisplace = texEval(displacement, shiftedCtx);
        Float displace = texEval(displacement, ctx);

        // Compute bump-mapped differential geometry
        *dpdu = ctx.shading.dpdu + (uDisplace - displace) / du * Vector3f(ctx.shading.n) +
                displace * Vector3f(ctx.shading.dndu);
        *dpdv = ctx.shading.dpdv + (vDisplace - displace) / dv * Vector3f(ctx.shading.n) +
                displace * Vector3f(ctx.shading.dndv);

    } else {
        // Sample normal map to compute shading normal
        WrapMode2D wrap(WrapMode::Repeat);
        Point2f uv(ctx.uv[0], 1 - ctx.uv[1]);
        Vector3f ns(2 * normalMap->BilerpChannel(uv, 0, wrap) - 1,
                    2 * normalMap->BilerpChannel(uv, 1, wrap) - 1,
                    2 * normalMap->BilerpChannel(uv, 2, wrap) - 1);
        ns = Normalize(ns);
        Frame frame = Frame::FromZ(ctx.shading.n);
        ns = frame.FromLocal(ns);

        Float ulen = Length(ctx.shading.dpdu), vlen = Length(ctx.shading.dpdv);
        *dpdu = Normalize(GramSchmidt(ctx.shading.dpdu, ns)) * ulen;
        *dpdv = Normalize(Cross(ns, *dpdu)) * vlen;
    }
}